

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

void __thiscall QFSFileEnginePrivate::unmapAll(QFSFileEnginePrivate *this)

{
  bool bVar1;
  QList<unsigned_char_*> *this_00;
  qsizetype qVar2;
  QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *in_RDI;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *in_stack_00000028;
  int i;
  QList<unsigned_char_*> keys;
  uchar *in_stack_00000098;
  qsizetype in_stack_ffffffffffffffa8;
  int local_2c;
  QList<unsigned_char_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::isEmpty(in_RDI + 0x16);
  if (!bVar1) {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (uchar **)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::keys(in_RDI);
    local_2c = 0;
    while( true ) {
      this_00 = (QList<unsigned_char_*> *)(long)local_2c;
      qVar2 = QList<unsigned_char_*>::size(&local_20);
      if (qVar2 <= (long)this_00) break;
      QList<unsigned_char_*>::at(this_00,in_stack_ffffffffffffffa8);
      unmap(in_stack_00000028,in_stack_00000098);
      local_2c = local_2c + 1;
    }
    QList<unsigned_char_*>::~QList((QList<unsigned_char_*> *)0x2bc4a1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFSFileEnginePrivate::unmapAll()
{
    if (!maps.isEmpty()) {
        const QList<uchar*> keys = maps.keys(); // Make a copy since unmap() modifies the map.
        for (int i = 0; i < keys.size(); ++i)
            unmap(keys.at(i));
    }
}